

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_representation.cpp
# Opt level: O0

void __thiscall mjs::value_representation::fixup(value_representation *this,gc_heap *old_heap)

{
  bool bVar1;
  value_type vVar2;
  value_type type;
  gc_heap *old_heap_local;
  value_representation *this_local;
  
  bVar1 = is_special(this->repr_);
  if (bVar1) {
    vVar2 = type_from_repr(this->repr_);
    switch(vVar2) {
    case undefined:
    case null:
    case boolean:
    case number:
      break;
    case string:
    case object:
      if ((ulong)*(uint *)((long)&this->repr_ + 4) !=
          ((long)(int)vVar2 + 1 << 0x30 | 0x7ff0000000000000U) >> 0x20) {
        __assert_fail("reinterpret_cast<uint32_t*>(&repr_)[1] == (nan_bits | (static_cast<uint64_t>(type)+1)<<type_shift)>>32"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value_representation.cpp"
                      ,0x61,"void mjs::value_representation::fixup(gc_heap &)");
      }
      gc_heap::register_fixup(old_heap,(uint32_t *)this);
      break;
    default:
      abort();
    }
  }
  return;
}

Assistant:

void value_representation::fixup(gc_heap& old_heap) {
    if (!is_special(repr_)) {
        return;
    }
    const auto type = type_from_repr(repr_);
    switch (type) {
    case value_type::undefined: [[fallthrough]];
    case value_type::null:      [[fallthrough]];
    case value_type::boolean:   [[fallthrough]];
    case value_type::number:
        return;
    case value_type::string:    [[fallthrough]];
    case value_type::object:
        // TODO: See note in gc_heap_ptr_untracked about adding a (debug) check for whether fixup was done correctly
        // FIXME: This only works on little endian platforms!
        assert(reinterpret_cast<uint32_t*>(&repr_)[1] == (nan_bits | (static_cast<uint64_t>(type)+1)<<type_shift)>>32);
        old_heap.register_fixup(*reinterpret_cast<uint32_t*>(&repr_));
        break;
    default:
        std::abort();
    }
}